

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_RecGroupIndices_Test::TestBody(TypeTest_RecGroupIndices_Test *this)

{
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  char *pcVar1;
  char *in_R9;
  pointer *__ptr;
  undefined1 local_88 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_68;
  byte local_50;
  TypeBuilder local_40;
  TypeBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  AssertHelper local_28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  ::wasm::TypeBuilder::TypeBuilder(&local_40,5);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_40,0);
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x0);
  if ((void *)local_68._0_8_ != (void *)0x0) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
  }
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x1);
  if ((void *)local_68._0_8_ != (void *)0x0) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
  }
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_40,2);
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x2);
  if ((void *)local_68._0_8_ != (void *)0x0) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
  }
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x3);
  if ((void *)local_68._0_8_ != (void *)0x0) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
  }
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x4);
  if ((void *)local_68._0_8_ != (void *)0x0) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
  }
  ::wasm::TypeBuilder::build();
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_1_ = local_50 == 0;
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)(char)builder.impl._M_t.
                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&local_68._M_first);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_88,__x);
    local_20._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::wasm::HeapType::getRecGroup();
    local_28.data_ = (AssertHelperData *)::wasm::HeapType::getRecGroup();
    testing::internal::CmpHelperEQ<wasm::RecGroup,wasm::RecGroup>
              ((internal *)&builder,"built[0].getRecGroup()","built[1].getRecGroup()",
               (RecGroup *)&local_20,(RecGroup *)&local_28);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x156,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_20._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_20._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::wasm::HeapType::getRecGroupIndex();
    local_28.data_ = local_28.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&builder,"built[0].getRecGroupIndex()","0u",(unsigned_long *)&local_20,
               (uint *)&local_28);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x157,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_20._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_20._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::wasm::HeapType::getRecGroupIndex();
    local_28.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&builder,"built[1].getRecGroupIndex()","1u",(unsigned_long *)&local_20,
               (uint *)&local_28);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x158,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_20._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_20._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::wasm::HeapType::getRecGroup();
    local_28.data_ = (AssertHelperData *)::wasm::HeapType::getRecGroup();
    testing::internal::CmpHelperEQ<wasm::RecGroup,wasm::RecGroup>
              ((internal *)&builder,"built[2].getRecGroup()","built[3].getRecGroup()",
               (RecGroup *)&local_20,(RecGroup *)&local_28);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x15a,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_20._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_20._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::wasm::HeapType::getRecGroup();
    local_28.data_ = (AssertHelperData *)::wasm::HeapType::getRecGroup();
    testing::internal::CmpHelperEQ<wasm::RecGroup,wasm::RecGroup>
              ((internal *)&builder,"built[3].getRecGroup()","built[4].getRecGroup()",
               (RecGroup *)&local_20,(RecGroup *)&local_28);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x15b,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_20._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_20._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::wasm::HeapType::getRecGroupIndex();
    local_28.data_ = local_28.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&builder,"built[2].getRecGroupIndex()","0u",(unsigned_long *)&local_20,
               (uint *)&local_28);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x15c,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_20._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_20._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::wasm::HeapType::getRecGroupIndex();
    local_28.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&builder,"built[3].getRecGroupIndex()","1u",(unsigned_long *)&local_20,
               (uint *)&local_28);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x15d,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_20._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_20._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::wasm::HeapType::getRecGroupIndex();
    local_28.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&builder,"built[4].getRecGroupIndex()","2u",(unsigned_long *)&local_20,
               (uint *)&local_28);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x15e,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_20._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88,
                      (long)built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_88);
    }
  }
  else {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&builder,(AssertionResult *)"result","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x153,(char *)local_88);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_88 !=
        (undefined1  [8])
        &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)local_88,
                      (ulong)((long)&(built.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
    }
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_50]._M_data)
            ((anon_class_1_0_00000001 *)local_88,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&local_68._M_first);
  ::wasm::TypeBuilder::~TypeBuilder(&local_40);
  return;
}

Assistant:

TEST_F(TypeTest, RecGroupIndices) {
  TypeBuilder builder(5);

  builder.createRecGroup(0, 2);
  builder[0] = Struct{};
  builder[1] = Struct{};

  builder.createRecGroup(2, 3);
  builder[2] = Struct{};
  builder[3] = Struct{};
  builder[4] = Struct{};

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0].getRecGroup(), built[1].getRecGroup());
  EXPECT_EQ(built[0].getRecGroupIndex(), 0u);
  EXPECT_EQ(built[1].getRecGroupIndex(), 1u);

  EXPECT_EQ(built[2].getRecGroup(), built[3].getRecGroup());
  EXPECT_EQ(built[3].getRecGroup(), built[4].getRecGroup());
  EXPECT_EQ(built[2].getRecGroupIndex(), 0u);
  EXPECT_EQ(built[3].getRecGroupIndex(), 1u);
  EXPECT_EQ(built[4].getRecGroupIndex(), 2u);
}